

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

QString * __thiscall QtCbor::ByteData::toUtf8String(ByteData *this)

{
  ByteData *in_RSI;
  QString *in_RDI;
  char *unaff_retaddr;
  QString *size;
  
  size = in_RDI;
  byte(in_RSI);
  QString::fromUtf8(unaff_retaddr,(qsizetype)size);
  return in_RDI;
}

Assistant:

QString toUtf8String() const    { return QString::fromUtf8(byte(), len); }